

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMaxDown
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *dispatcher,bool updateOverlaps)

{
  Handle *pHVar1;
  Handle *pHVar2;
  short *psVar3;
  unsigned_short *puVar4;
  Edge EVar5;
  cbtOverlappingPairCallback *pcVar6;
  ushort uVar7;
  ulong uVar8;
  undefined6 in_register_00000012;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Handle *handle1;
  Edge *pEVar13;
  
  lVar10 = (long)axis;
  pEVar13 = this->m_pEdges[lVar10];
  uVar8 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar7 = pEVar13[uVar8 - 1].m_pos;
  if (pEVar13[uVar8].m_pos < uVar7) {
    pEVar13 = pEVar13 + uVar8;
    uVar11 = 1 << (axis & 0x1fU) & 3;
    uVar12 = 1 << uVar11 & 3;
    puVar4 = this->m_pHandles[pEVar13->m_handle].m_maxEdges + lVar10;
    do {
      pHVar1 = this->m_pHandles + pEVar13[-1].m_handle;
      lVar9 = 0x3a;
      if (((((uVar7 & 1) == 0) && (lVar9 = 0x34, updateOverlaps)) &&
          (pHVar2 = this->m_pHandles + pEVar13->m_handle,
          *(ushort *)
           ((long)(&(pHVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar11 * 2)) <=
          *(ushort *)((long)pHVar2->m_maxEdges + (ulong)(uVar11 * 2)))) &&
         (((*(ushort *)
             ((long)(&(pHVar2->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar11 * 2)) <=
            *(ushort *)((long)pHVar1->m_maxEdges + (ulong)(uVar11 * 2)) &&
           (uVar8 = (ulong)(uVar12 * 2),
           *(ushort *)((long)(&(pHVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar8) <=
           *(ushort *)((long)pHVar2->m_maxEdges + uVar8))) &&
          (uVar8 = (ulong)(uVar12 * 2),
          *(ushort *)((long)(&(pHVar2->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar8) <=
          *(ushort *)((long)pHVar1->m_maxEdges + uVar8))))) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar2,pHVar1);
        pcVar6 = this->m_userPairCallback;
        if (pcVar6 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar6->_vptr_cbtOverlappingPairCallback[3])(pcVar6,pHVar2,pHVar1,dispatcher);
        }
      }
      psVar3 = (short *)((long)(pHVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                        lVar10 * 2 + lVar9 + -0x14);
      *psVar3 = *psVar3 + 1;
      *puVar4 = *puVar4 - 1;
      EVar5 = *pEVar13;
      *pEVar13 = pEVar13[-1];
      pEVar13[-1] = EVar5;
      uVar7 = pEVar13[-2].m_pos;
      pEVar13 = pEVar13 + -1;
    } while (EVar5.m_pos < uVar7);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;

			if (updateOverlaps
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0, handle1, axis1, axis2)
#endif  //USE_OVERLAP_TEST_ON_REMOVES
			)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				m_pairCache->removeOverlappingPair(handle0, handle1, dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0, handle1, dispatcher);
			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;
			;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}